

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

int AF_A_JabDagger(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  int iVar1;
  uint uVar2;
  APowerStrength *pAVar3;
  char *name;
  bool bVar4;
  bool local_ca;
  bool local_c7;
  FSoundID local_c4;
  TFlags<ActorFlag,_unsigned_int> local_c0;
  FSoundID local_bc;
  FName local_b8;
  FName local_b4;
  TAngle<double> local_b0;
  TAngle<double> local_a8;
  TAngle<double> local_a0;
  undefined1 local_98 [16];
  TAngle<double> local_88;
  undefined1 local_80 [8];
  FTranslatedLineTarget t;
  int power;
  DAngle pitch;
  int damage;
  DAngle angle;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    this = *(AActor **)&param->field_0;
    local_c7 = true;
    if (this != (AActor *)0x0) {
      local_c7 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    }
    if (local_c7 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((param[1].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
        bVar4 = param[1].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      this_00 = (DObject *)param[1].field_0.field_1.a;
      local_ca = true;
      if (this_00 != (DObject *)0x0) {
        local_ca = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
      }
      if (local_ca == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
      angle.Degrees = 0.0;
    }
    else {
      bVar4 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, param[2].field_0.field_1.atag != 8)) {
        bVar4 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                      ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      angle.Degrees = (double)param[2].field_0.field_1.a;
    }
    TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffb0);
    TAngle<double>::TAngle((TAngle<double> *)&stack0xffffffffffffffa0);
    FTranslatedLineTarget::FTranslatedLineTarget((FTranslatedLineTarget *)local_80);
    t._20_4_ = MIN<int>(10,(this->player->mo->super_AActor).stamina / 10);
    iVar1 = FRandom::operator()(&pr_jabdagger);
    pitch.Degrees._4_4_ = (iVar1 % (t._20_4_ + 8)) * (t._20_4_ + 2);
    pAVar3 = AActor::FindInventory<APowerStrength>(this);
    if (pAVar3 != (APowerStrength *)0x0) {
      pitch.Degrees._4_4_ = pitch.Degrees._4_4_ * 10;
    }
    iVar1 = FRandom::Random2(&pr_jabdagger);
    TAngle<double>::operator+(&local_88,(double)iVar1 * 0.02197265625);
    TAngle<double>::operator=((TAngle<double> *)&stack0xffffffffffffffb0,&local_88);
    TAngle<double>::TAngle((TAngle<double> *)local_98,(TAngle<double> *)&stack0xffffffffffffffb0);
    TAngle<double>::TAngle(&local_a0,0.0);
    P_AimLineAttack((AActor *)(local_98 + 8),(DAngle *)this,80.0,(FTranslatedLineTarget *)local_98,
                    (DAngle *)0x0,(int)&local_a0,(AActor *)0x0,(AActor *)0x0);
    TAngle<double>::operator=
              ((TAngle<double> *)&stack0xffffffffffffffa0,(TAngle<double> *)(local_98 + 8));
    TAngle<double>::TAngle(&local_a8,(TAngle<double> *)&stack0xffffffffffffffb0);
    TAngle<double>::TAngle(&local_b0,(TAngle<double> *)&stack0xffffffffffffffa0);
    iVar1 = pitch.Degrees._4_4_;
    FName::FName(&local_b4,NAME_Melee);
    FName::FName(&local_b8,"StrifeSpark");
    P_LineAttack(this,&local_a8,80.0,&local_b0,iVar1,&local_b4,&local_b8,1,
                 (FTranslatedLineTarget *)local_80,(int *)0x0);
    if (local_80 == (undefined1  [8])0x0) {
      FSoundID::FSoundID(&local_c4,"misc/swish");
      S_Sound(this,1,&local_c4,1.0,1.0);
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_c0,
                 local_80._0_4_ + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_c0);
      name = "misc/meathit";
      if (uVar2 != 0) {
        name = "misc/metalhit";
      }
      FSoundID::FSoundID(&local_bc,name);
      S_Sound(this,1,&local_bc,1.0,1.0);
      TAngle<double>::operator=(&(this->Angles).Yaw,(TAngle<double> *)&t);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_JUSTATTACKED);
      P_DaggerAlert(this,(AActor *)local_80);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x61,"int AF_A_JabDagger(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_JabDagger)
{
	PARAM_ACTION_PROLOGUE;

	DAngle 	angle;
	int 		damage;
	DAngle 		pitch;
	int			power;
	FTranslatedLineTarget t;

	power = MIN(10, self->player->mo->stamina / 10);
	damage = (pr_jabdagger() % (power + 8)) * (power + 2);

	if (self->FindInventory<APowerStrength>())
	{
		damage *= 10;
	}

	angle = self->Angles.Yaw + pr_jabdagger.Random2() * (5.625 / 256);
	pitch = P_AimLineAttack (self, angle, 80.);
	P_LineAttack (self, angle, 80., pitch, damage, NAME_Melee, "StrifeSpark", true, &t);

	// turn to face target
	if (t.linetarget)
	{
		S_Sound (self, CHAN_WEAPON,
			t.linetarget->flags & MF_NOBLOOD ? "misc/metalhit" : "misc/meathit",
			1, ATTN_NORM);
		self->Angles.Yaw = t.angleFromSource;
		self->flags |= MF_JUSTATTACKED;
		P_DaggerAlert (self, t.linetarget);
	}
	else
	{
		S_Sound (self, CHAN_WEAPON, "misc/swish", 1, ATTN_NORM);
	}
	return 0;
}